

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaAllocator_T::CalculateStatistics(VmaAllocator_T *this,VmaTotalStatistics *pStats)

{
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  VmaDetailedStatistics *src;
  long lVar4;
  VmaDedicatedAllocationList *this_00;
  VmaTotalStatistics *pVVar5;
  VmaBlockVector *blockVector;
  ulong uVar6;
  pthread_rwlock_t *__rwlock;
  ItemType *this_01;
  
  *(undefined8 *)((long)&(pStats->total).statistics.blockBytes + 4) = 0;
  *(undefined8 *)((long)&(pStats->total).statistics.allocationBytes + 4) = 0;
  (pStats->total).statistics.blockCount = 0;
  (pStats->total).statistics.allocationCount = 0;
  (pStats->total).statistics.blockBytes = 0;
  (pStats->total).allocationSizeMin = 0xffffffffffffffff;
  (pStats->total).allocationSizeMax = 0;
  (pStats->total).unusedRangeSizeMin = 0xffffffffffffffff;
  (pStats->total).unusedRangeSizeMax = 0;
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)&pStats->memoryType[0].statistics.blockBytes + lVar4 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pStats->memoryType[0].statistics.blockCount + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pStats->memoryType[0].allocationSizeMin + lVar4) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryType[0].allocationSizeMax + lVar4) = 0;
    *(undefined8 *)((long)&pStats->memoryType[0].unusedRangeSizeMin + lVar4) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryType[0].unusedRangeSizeMax + lVar4) = 0;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x800);
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)&pStats->memoryHeap[0].statistics.blockBytes + lVar4 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pStats->memoryHeap[0].statistics.blockCount + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pStats->memoryHeap[0].allocationSizeMin + lVar4) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryHeap[0].allocationSizeMax + lVar4) = 0;
    *(undefined8 *)((long)&pStats->memoryHeap[0].unusedRangeSizeMin + lVar4) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryHeap[0].unusedRangeSizeMax + lVar4) = 0;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x400);
  if ((this->m_MemProps).memoryTypeCount != 0) {
    uVar6 = 0;
    pVVar5 = pStats;
    do {
      if (this->m_pBlockVectors[uVar6] != (VmaBlockVector *)0x0) {
        VmaBlockVector::AddDetailedStatistics(this->m_pBlockVectors[uVar6],pVVar5->memoryType);
      }
      uVar6 = uVar6 + 1;
      pVVar5 = (VmaTotalStatistics *)(pVVar5->memoryType + 1);
    } while (uVar6 < (this->m_MemProps).memoryTypeCount);
  }
  bVar2 = this->m_UseMutex;
  __rwlock = (pthread_rwlock_t *)0x0;
  if (bVar2 != false) {
    __rwlock = (pthread_rwlock_t *)&this->m_PoolsMutex;
  }
  if (bVar2 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  for (this_01 = (this->m_Pools).m_Front; this_01 != (ItemType *)0x0; this_01 = this_01->m_NextPool)
  {
    uVar3 = (this_01->m_BlockVector).m_MemoryTypeIndex;
    VmaBlockVector::AddDetailedStatistics(&this_01->m_BlockVector,pStats->memoryType + uVar3);
    VmaDedicatedAllocationList::AddDetailedStatistics
              (&this_01->m_DedicatedAllocations,pStats->memoryType + uVar3);
  }
  if (bVar2 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  if ((this->m_MemProps).memoryTypeCount != 0) {
    this_00 = this->m_DedicatedAllocations;
    uVar6 = 0;
    pVVar5 = pStats;
    do {
      VmaDedicatedAllocationList::AddDetailedStatistics(this_00,pVVar5->memoryType);
      uVar6 = uVar6 + 1;
      this_00 = this_00 + 1;
      pVVar5 = (VmaTotalStatistics *)(pVVar5->memoryType + 1);
    } while (uVar6 < (this->m_MemProps).memoryTypeCount);
  }
  if ((this->m_MemProps).memoryTypeCount != 0) {
    uVar6 = 0;
    pVVar5 = pStats;
    do {
      VmaAddDetailedStatistics
                (pStats->memoryHeap + (this->m_MemProps).memoryTypes[uVar6].heapIndex,
                 pVVar5->memoryType);
      uVar6 = uVar6 + 1;
      pVVar5 = (VmaTotalStatistics *)(pVVar5->memoryType + 1);
    } while (uVar6 < (this->m_MemProps).memoryTypeCount);
  }
  if ((this->m_MemProps).memoryHeapCount != 0) {
    src = pStats->memoryHeap;
    uVar6 = 0;
    do {
      VmaAddDetailedStatistics(&pStats->total,src);
      uVar6 = uVar6 + 1;
      src = src + 1;
    } while (uVar6 < (this->m_MemProps).memoryHeapCount);
  }
  return;
}

Assistant:

void VmaAllocator_T::CalculateStatistics(VmaTotalStatistics* pStats)
{
    // Initialize.
    VmaClearDetailedStatistics(pStats->total);
    for(uint32_t i = 0; i < VK_MAX_MEMORY_TYPES; ++i)
        VmaClearDetailedStatistics(pStats->memoryType[i]);
    for(uint32_t i = 0; i < VK_MAX_MEMORY_HEAPS; ++i)
        VmaClearDetailedStatistics(pStats->memoryHeap[i]);

    // Process default pools.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        VmaBlockVector* const pBlockVector = m_pBlockVectors[memTypeIndex];
        if (pBlockVector != VMA_NULL)
            pBlockVector->AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
    }

    // Process custom pools.
    {
        VmaMutexLockRead lock(m_PoolsMutex, m_UseMutex);
        for(VmaPool pool = m_Pools.Front(); pool != VMA_NULL; pool = m_Pools.GetNext(pool))
        {
            VmaBlockVector& blockVector = pool->m_BlockVector;
            const uint32_t memTypeIndex = blockVector.GetMemoryTypeIndex();
            blockVector.AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
            pool->m_DedicatedAllocations.AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
        }
    }

    // Process dedicated allocations.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        m_DedicatedAllocations[memTypeIndex].AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
    }

    // Sum from memory types to memory heaps.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        const uint32_t memHeapIndex = m_MemProps.memoryTypes[memTypeIndex].heapIndex;
        VmaAddDetailedStatistics(pStats->memoryHeap[memHeapIndex], pStats->memoryType[memTypeIndex]);
    }

    // Sum from memory heaps to total.
    for(uint32_t memHeapIndex = 0; memHeapIndex < GetMemoryHeapCount(); ++memHeapIndex)
        VmaAddDetailedStatistics(pStats->total, pStats->memoryHeap[memHeapIndex]);

    VMA_ASSERT(pStats->total.statistics.allocationCount == 0 ||
        pStats->total.allocationSizeMax >= pStats->total.allocationSizeMin);
    VMA_ASSERT(pStats->total.unusedRangeCount == 0 ||
        pStats->total.unusedRangeSizeMax >= pStats->total.unusedRangeSizeMin);
}